

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

SPIRVariable * __thiscall
spirv_cross::CompilerGLSL::find_color_output_by_location(CompilerGLSL *this,uint32_t location)

{
  uint id;
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  uint32_t uVar3;
  SPIRVariable *pSVar4;
  SPIRVariable *pSVar5;
  long lVar6;
  LoopLock local_40;
  ParsedIR *local_38;
  
  local_38 = &(this->super_Compiler).ir;
  ParsedIR::create_loop_hard_lock(local_38);
  pTVar1 = (this->super_Compiler).ir.ids_for_type[2].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar2 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  pSVar5 = (SPIRVariable *)0x0;
  for (lVar6 = 0; sVar2 << 2 != lVar6; lVar6 = lVar6 + 4) {
    id = *(uint *)((long)&pTVar1->id + lVar6);
    if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[id].type ==
        TypeVariable) {
      pSVar4 = ParsedIR::get<spirv_cross::SPIRVariable>(local_38,id);
      if (pSVar4->storage == StorageClassOutput) {
        uVar3 = Compiler::get_decoration
                          (&this->super_Compiler,(ID)(pSVar4->super_IVariant).self.id,
                           DecorationLocation);
        if (uVar3 == location) {
          pSVar5 = pSVar4;
        }
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock(&local_40);
  return pSVar5;
}

Assistant:

const SPIRVariable *CompilerGLSL::find_color_output_by_location(uint32_t location) const
{
	const SPIRVariable *ret = nullptr;
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		if (var.storage == StorageClassOutput && get_decoration(var.self, DecorationLocation) == location)
			ret = &var;
	});
	return ret;
}